

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall LLVMBC::ICmpInst::ICmpInst(ICmpInst *this,Predicate pred_,Value *LHS,Value *RHS)

{
  initializer_list<LLVMBC::Value_*> __l;
  allocator_type local_61;
  Value *local_60;
  Value *local_58;
  iterator local_50;
  undefined8 local_48;
  vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> local_40;
  Value *local_28;
  Value *RHS_local;
  Value *LHS_local;
  ICmpInst *pIStack_10;
  Predicate pred__local;
  ICmpInst *this_local;
  
  local_28 = RHS;
  RHS_local = LHS;
  LHS_local._4_4_ = pred_;
  pIStack_10 = this;
  CmpInst::CmpInst(&this->super_CmpInst,ICmp,pred_,LHS,RHS);
  local_60 = RHS_local;
  local_58 = local_28;
  local_50 = &local_60;
  local_48 = 2;
  __l._M_len = 2;
  __l._M_array = local_50;
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::vector
            (&local_40,__l,&local_61);
  Instruction::set_operands((Instruction *)this,&local_40);
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::~vector(&local_40)
  ;
  return;
}

Assistant:

ICmpInst::ICmpInst(Predicate pred_, Value *LHS, Value *RHS)
    : CmpInst(ValueKind::ICmp, pred_, LHS, RHS)
{
	set_operands({ LHS, RHS });
}